

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternMatcher.cpp
# Opt level: O2

void __thiscall
AssemblyCode::PatternMatcher::GenerateCodeForNode
          (PatternMatcher *this,INode *node,CTemp *dest,AssemblyCommands *commands)

{
  __shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer ppVar2;
  pointer psVar3;
  int iVar4;
  __shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer ppVar6;
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  shared_ptr<IRT::TreePattern> pattern;
  INode *local_70;
  ChildrenTemps children;
  AssemblyCommands nodeCommands;
  
  nodeCommands.
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nodeCommands.
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  nodeCommands.
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  children.
  super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  children.
  super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  children.
  super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var5 = &((this->patterns).
             super__Vector_base<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>;
  p_Var1 = &((this->patterns).
             super__Vector_base<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>;
  do {
    if (p_Var5 == p_Var1) {
      __assert_fail("result",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/utils/PatternMatcher.cpp"
                    ,0x18,
                    "void AssemblyCode::PatternMatcher::GenerateCodeForNode(const IRT::INode *, const IRT::CTemp &, AssemblyCommands &)"
                   );
    }
    std::__shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&pattern.super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>,p_Var5);
    std::
    vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
    ::clear(&children);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
    ::clear(&nodeCommands);
    iVar4 = (*(pattern.super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_TreePattern[4])
                      (pattern.super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,node,dest,&children,&nodeCommands);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pattern.super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    ppVar2 = children.
             super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    p_Var5 = p_Var5 + 1;
  } while ((char)iVar4 == '\0');
  for (ppVar6 = children.
                super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar3 = nodeCommands.
               super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, ppVar6 != ppVar2; ppVar6 = ppVar6 + 1) {
    std::pair<IRT::CTemp,_const_IRT::INode_*>::pair
              ((pair<IRT::CTemp,_const_IRT::INode_*> *)&pattern,ppVar6);
    GenerateCodeForNode(this,local_70,(CTemp *)&pattern,commands);
    std::__cxx11::string::~string((string *)&pattern);
  }
  for (p_Var7 = &(nodeCommands.
                  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
      p_Var7 != &psVar3->
                 super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
      p_Var7 = p_Var7 + 1) {
    std::__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *)&pattern,
               p_Var7);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
    ::push_back(commands,(value_type *)&pattern);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pattern.super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  std::
  vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
  ::~vector(&children);
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::~vector(&nodeCommands);
  return;
}

Assistant:

void AssemblyCode::PatternMatcher::GenerateCodeForNode( const IRT::INode *node, const IRT::CTemp &dest,
                                                        AssemblyCommands &commands ) {

    AssemblyCommands nodeCommands;
    ChildrenTemps children;
    bool result = false;
    int i = 0;
    for ( auto pattern : patterns ) {
        children.clear( );
        nodeCommands.clear( );
        result = pattern->TryToGenerateCode( node, dest, children, nodeCommands );
        if ( result ) {
            break;
        }
        ++i;
    }
    assert( result );
    for ( auto child : children ) {
        GenerateCodeForNode( child.second, child.first, commands );
    }
    for ( auto command: nodeCommands ) {
        commands.push_back( command );
    }
}